

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::cord_internal::anon_unknown_16::CordRepAnalyzer::AnalyzeBtree
          (CordRepAnalyzer *this,RepRef rep)

{
  int iVar1;
  iterator ppCVar2;
  RepRef rep_00;
  CordRep *edge_1;
  iterator __end4_1;
  iterator __begin4_1;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_70;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4_1;
  CordRep *local_58;
  CordRep *edge;
  iterator __end4;
  iterator __begin4;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_30;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range4;
  CordRepBtree *tree;
  CordRepAnalyzer *this_local;
  RepRef rep_local;
  
  rep_local.rep = (CordRep *)rep.refcount;
  this_local = (CordRepAnalyzer *)rep.rep;
  this->statistics_->node_count = this->statistics_->node_count + 1;
  (this->statistics_->node_counts).btree = (this->statistics_->node_counts).btree + 1;
  tree = (CordRepBtree *)this;
  MemoryUsage::Add(&this->memory_usage_,0x40,(size_t)rep_local.rep);
  __range4 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)
             CordRep::btree((CordRep *)this_local);
  iVar1 = CordRepBtree::height((CordRepBtree *)__range4);
  if (iVar1 < 1) {
    ___begin4_1 = CordRepBtree::Edges((CordRepBtree *)__range4);
    local_70 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4_1;
    __end4_1 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_70);
    ppCVar2 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_70);
    for (; __end4_1 != ppCVar2; __end4_1 = __end4_1 + 1) {
      rep_00 = RepRef::Child((RepRef *)&this_local,*__end4_1);
      CountLinearReps(this,rep_00,&this->memory_usage_);
    }
  }
  else {
    ___begin4 = CordRepBtree::Edges((CordRepBtree *)__range4);
    local_30 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin4;
    __end4 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_30);
    edge = (CordRep *)Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_30);
    for (; (CordRep *)__end4 != edge; __end4 = __end4 + 1) {
      local_58 = *__end4;
      ___range4_1 = RepRef::Child((RepRef *)&this_local,local_58);
      AnalyzeBtree(this,___range4_1);
    }
  }
  return;
}

Assistant:

void AnalyzeBtree(RepRef rep) {
    statistics_.node_count++;
    statistics_.node_counts.btree++;
    memory_usage_.Add(sizeof(CordRepBtree), rep.refcount);
    const CordRepBtree* tree = rep.rep->btree();
    if (tree->height() > 0) {
      for (CordRep* edge : tree->Edges()) {
        AnalyzeBtree(rep.Child(edge));
      }
    } else {
      for (CordRep* edge : tree->Edges()) {
        CountLinearReps(rep.Child(edge), memory_usage_);
      }
    }
  }